

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Consumable.cpp
# Opt level: O0

shared_ptr<Consumable> Consumable::generateConsumable(void)

{
  int iVar1;
  time_t tVar2;
  Consumable *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<Consumable> sVar3;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38 [8];
  string hpn;
  int hp;
  uint seed;
  shared_ptr<Consumable> *cons;
  
  tVar2 = time((time_t *)0x0);
  hpn.field_2._12_4_ = (undefined4)tVar2;
  srand(hpn.field_2._12_4_);
  iVar1 = rand();
  hpn.field_2._8_4_ = iVar1 % 100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Lesser Health Potion",&local_39);
  std::allocator<char>::~allocator(&local_39);
  if ((int)hpn.field_2._8_4_ < 0x51) {
    if (0x32 < (int)hpn.field_2._8_4_) {
      std::__cxx11::string::operator=(local_38,"Great Health Potion");
    }
  }
  else {
    std::__cxx11::string::operator=(local_38,"Greater Health Potion");
  }
  local_4d = 0;
  this = (Consumable *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_70,local_38);
  Consumable(this,&local_70,(long)(int)hpn.field_2._8_4_);
  std::shared_ptr<Consumable>::shared_ptr<Consumable,void>((shared_ptr<Consumable> *)in_RDI,this);
  std::__cxx11::string::~string((string *)&local_70);
  local_4d = 1;
  std::__cxx11::string::~string(local_38);
  sVar3.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Consumable>)sVar3.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Consumable> Consumable::generateConsumable() {
    unsigned seed = time(0);
    srand(seed);
    int hp = rand() % 100;
    std::string hpn = "Lesser Health Potion";
    if(hp > 80)
        hpn = "Greater Health Potion";
    else if(hp > 50)
        hpn = "Great Health Potion";

    std::shared_ptr<Consumable> cons(new Consumable(hpn, hp));

    return cons;
}